

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlankingSector.cpp
# Opt level: O3

void __thiscall DIS::BlankingSector::BlankingSector(BlankingSector *this)

{
  this->_vptr_BlankingSector = (_func_int **)&PTR__BlankingSector_001b3ba0;
  this->_recordType = 0xdac;
  this->_recordLength = 0;
  this->_emitterNumber = '\0';
  this->_beamNumber = '\0';
  this->_stateIndicator = '\0';
  this->_leftAzimuth = 0.0;
  this->_rightAzimuth = 0.0;
  this->_lowerElevation = 0.0;
  this->_upperElevation = 0.0;
  this->_residualPower = 0.0;
  return;
}

Assistant:

BlankingSector::BlankingSector():
   _recordType(3500), 
   _recordLength(0), 
   _emitterNumber(0), 
   _beamNumber(0), 
   _stateIndicator(0), 
   _leftAzimuth(0.0), 
   _rightAzimuth(0.0), 
   _lowerElevation(0.0), 
   _upperElevation(0.0), 
   _residualPower(0.0)
{
}